

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLVersionParser.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::VersionParser::VersionParser
          (VersionParser *this,IErrorHandler *errorHandler,FileLoader *fileLoader,int flags,
          int *parsedFlags)

{
  undefined4 in_ECX;
  IErrorHandler *in_RDX;
  IErrorHandler *in_RSI;
  Parser *in_RDI;
  SaxParser *in_R8;
  
  GeneratedSaxParser::Parser::Parser(in_RDI,in_RSI);
  in_RDI->_vptr_Parser = (_func_int **)&PTR__VersionParser_00db45b8;
  std::
  map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
  ::map((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
         *)0x796f5c);
  std::
  map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
  ::map((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
         *)0x796f6a);
  in_RDI[5]._vptr_Parser = (_func_int **)0x0;
  in_RDI[5].mSaxParser = (SaxParser *)0x0;
  in_RDI[5].mErrorHandler = in_RDX;
  *(undefined4 *)&in_RDI[6]._vptr_Parser = in_ECX;
  in_RDI[6].mSaxParser = in_R8;
  return;
}

Assistant:

VersionParser::VersionParser(GeneratedSaxParser::IErrorHandler* errorHandler,
        FileLoader* fileLoader,
        int flags,
        int& parsedFlags)
        : GeneratedSaxParser::Parser( errorHandler )
        , mPrivateParser14( 0 )
        , mPrivateParser15( 0 )
        , mFileLoader( fileLoader )
        , mFlags( flags )
        , mParsedFlags( parsedFlags )
    {

    }